

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcommon.cpp
# Opt level: O0

message * __thiscall message::to_string_abi_cxx11_(message *this)

{
  ostream *poVar1;
  uint64_t uVar2;
  string *psVar3;
  message *in_RSI;
  stringstream local_1a0 [8];
  stringstream buffer;
  ostream local_190 [384];
  message *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Message with id ");
  uVar2 = id(in_RSI);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1," has contents ");
  poVar1 = std::operator<<(poVar1,"\'");
  psVar3 = body_abi_cxx11_(in_RSI);
  poVar1 = std::operator<<(poVar1,(string *)psVar3);
  std::operator<<(poVar1,"\'");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string message::to_string() {
    std::stringstream buffer;
    buffer << "Message with id " << id() << " has contents " << "'" << body() << "'";
    return buffer.str();
}